

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.c
# Opt level: O0

int get_pred_context_brf_or_arf2(MACROBLOCKD *xd)

{
  int local_20;
  int pred_context;
  int arf2_count;
  int brf_count;
  uint8_t *ref_counts;
  MACROBLOCKD *xd_local;
  
  if (xd->neighbors_ref_counts[5] == xd->neighbors_ref_counts[6]) {
    local_20 = 1;
  }
  else {
    local_20 = 2;
    if (xd->neighbors_ref_counts[5] < xd->neighbors_ref_counts[6]) {
      local_20 = 0;
    }
  }
  return local_20;
}

Assistant:

static int get_pred_context_brf_or_arf2(const MACROBLOCKD *xd) {
  const uint8_t *const ref_counts = &xd->neighbors_ref_counts[0];

  // Count of BWDREF frames (B)
  const int brf_count = ref_counts[BWDREF_FRAME];
  // Count of ALTREF2 frames (A2)
  const int arf2_count = ref_counts[ALTREF2_FRAME];

  const int pred_context =
      (brf_count == arf2_count) ? 1 : ((brf_count < arf2_count) ? 0 : 2);

  assert(pred_context >= 0 && pred_context < REF_CONTEXTS);
  return pred_context;
}